

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O1

void __thiscall
adios2::transport::FileRemote::Read(FileRemote *this,char *buffer,size_t size,size_t start)

{
  size_type *psVar1;
  Remote *pRVar2;
  bool bVar3;
  char cVar4;
  undefined8 *puVar5;
  long *plVar6;
  int *piVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  size_t sVar11;
  ulong uVar12;
  char cVar13;
  ulong uVar14;
  string __str_1;
  string __str;
  string __str_3;
  string __str_4;
  string __str_2;
  string local_1d8;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  long lStack_180;
  ulong *local_178;
  long local_170;
  ulong local_168;
  long lStack_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  char *local_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  ulong *local_f0;
  uint local_e8;
  undefined4 uStack_e4;
  ulong local_e0 [2];
  string local_d0;
  string local_b0;
  string local_90;
  ulong *local_70;
  uint local_68;
  undefined4 uStack_64;
  ulong local_60 [2];
  char *local_50;
  uint local_48;
  char local_40 [16];
  
  if (start != 0xffffffffffffffff) {
    if (this->m_Size <= start) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Toolkit","");
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"transport::file::FileRemote","");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Read","");
      cVar13 = '\x01';
      if (9 < start) {
        sVar11 = start;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (sVar11 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0065cb46;
          }
          if (sVar11 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0065cb46;
          }
          if (sVar11 < 10000) goto LAB_0065cb46;
          bVar3 = 99999 < sVar11;
          sVar11 = sVar11 / 10000;
          cVar4 = cVar13 + '\x04';
        } while (bVar3);
        cVar13 = cVar13 + '\x01';
      }
LAB_0065cb46:
      local_178 = &local_168;
      std::__cxx11::string::_M_construct((ulong)&local_178,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_178,(uint)local_170,start);
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_178,0,(char *)0x0,0x75ce7c)
      ;
      local_158 = &local_148;
      puVar8 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar8) {
        local_148 = *puVar8;
        uStack_140 = puVar5[3];
      }
      else {
        local_148 = *puVar8;
        local_158 = (undefined8 *)*puVar5;
      }
      local_150 = puVar5[1];
      *puVar5 = puVar8;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_158);
      local_130 = &local_120;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_120 = *plVar9;
        lStack_118 = plVar6[3];
      }
      else {
        local_120 = *plVar9;
        local_130 = (long *)*plVar6;
      }
      local_128 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_130,
                                  (ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
      local_110 = &local_100;
      plVar9 = plVar6 + 2;
      if ((long *)*plVar6 == plVar9) {
        local_100 = *plVar9;
        lStack_f8 = plVar6[3];
      }
      else {
        local_100 = *plVar9;
        local_110 = (long *)*plVar6;
      }
      local_108 = plVar6[1];
      *plVar6 = (long)plVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_138 = buffer;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      puVar10 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar10) {
        local_1a8 = *puVar10;
        lStack_1a0 = plVar6[3];
        local_1b8 = &local_1a8;
      }
      else {
        local_1a8 = *puVar10;
        local_1b8 = (ulong *)*plVar6;
      }
      local_1b0 = plVar6[1];
      *plVar6 = (long)puVar10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      uVar14 = this->m_Size;
      cVar13 = '\x01';
      if (9 < uVar14) {
        uVar12 = uVar14;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (uVar12 < 100) {
            cVar13 = cVar13 + -2;
            goto LAB_0065cd66;
          }
          if (uVar12 < 1000) {
            cVar13 = cVar13 + -1;
            goto LAB_0065cd66;
          }
          if (uVar12 < 10000) goto LAB_0065cd66;
          bVar3 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar4 = cVar13 + '\x04';
        } while (bVar3);
        cVar13 = cVar13 + '\x01';
      }
LAB_0065cd66:
      local_198 = &local_188;
      std::__cxx11::string::_M_construct((ulong)&local_198,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_198,(uint)local_190,uVar14);
      uVar14 = 0xf;
      if (local_1b8 != &local_1a8) {
        uVar14 = local_1a8;
      }
      if (uVar14 < (ulong)(local_190 + local_1b0)) {
        uVar14 = 0xf;
        if (local_198 != &local_188) {
          uVar14 = local_188;
        }
        if (uVar14 < (ulong)(local_190 + local_1b0)) goto LAB_0065cdcb;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1b8);
      }
      else {
LAB_0065cdcb:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_198);
      }
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      psVar1 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_1d8.field_2._M_allocated_capacity = *psVar1;
        local_1d8.field_2._8_8_ = puVar5[3];
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *psVar1;
        local_1d8._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1d8._M_string_length = puVar5[1];
      *puVar5 = psVar1;
      puVar5[1] = 0;
      *(undefined1 *)psVar1 = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_90,&local_b0,&local_d0,&local_1d8,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8);
      }
      buffer = local_138;
      if (local_110 != &local_100) {
        operator_delete(local_110);
      }
      if (local_130 != &local_120) {
        operator_delete(local_130);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158);
      }
      if (local_178 != &local_168) {
        operator_delete(local_178);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
    }
    this->m_SeekPos = start;
    piVar7 = __errno_location();
    *piVar7 = 0;
    this->m_Errno = 0;
  }
  if (this->m_SeekPos + size <= this->m_Size) goto LAB_0065d64d;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Toolkit","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"transport::file::FileRemote","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Read","");
  cVar13 = '\x01';
  if (9 < size) {
    sVar11 = size;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (sVar11 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0065d040;
      }
      if (sVar11 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0065d040;
      }
      if (sVar11 < 10000) goto LAB_0065d040;
      bVar3 = 99999 < sVar11;
      sVar11 = sVar11 / 10000;
      cVar4 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_0065d040:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_50,local_48,size);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x7607c1);
  local_198 = &local_188;
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_188 = *puVar10;
    lStack_180 = plVar6[3];
  }
  else {
    local_188 = *puVar10;
    local_198 = (ulong *)*plVar6;
  }
  local_190 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_198);
  puVar10 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar10) {
    local_168 = *puVar10;
    lStack_160 = plVar6[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *puVar10;
    local_178 = (ulong *)*plVar6;
  }
  local_170 = plVar6[1];
  *plVar6 = (long)puVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar14 = this->m_SeekPos;
  cVar13 = '\x01';
  if (9 < uVar14) {
    uVar12 = uVar14;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (uVar12 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0065d18a;
      }
      if (uVar12 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0065d18a;
      }
      if (uVar12 < 10000) goto LAB_0065d18a;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_0065d18a:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_f0,local_e8,uVar14);
  uVar14 = CONCAT44(uStack_e4,local_e8) + local_170;
  uVar12 = 0xf;
  if (local_178 != &local_168) {
    uVar12 = local_168;
  }
  if (uVar12 < uVar14) {
    uVar12 = 0xf;
    if (local_f0 != local_e0) {
      uVar12 = local_e0[0];
    }
    if (uVar12 < uVar14) goto LAB_0065d20c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_178);
  }
  else {
LAB_0065d20c:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_178,(ulong)local_f0);
  }
  local_158 = &local_148;
  puVar8 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar8) {
    local_148 = *puVar8;
    uStack_140 = puVar5[3];
  }
  else {
    local_148 = *puVar8;
    local_158 = (undefined8 *)*puVar5;
  }
  local_150 = puVar5[1];
  *puVar5 = puVar8;
  puVar5[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
  local_130 = &local_120;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_120 = *plVar6;
    lStack_118 = puVar5[3];
  }
  else {
    local_120 = *plVar6;
    local_130 = (long *)*puVar5;
  }
  local_128 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_138 = (char *)start;
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_130,(ulong)(this->super_Transport).m_Name._M_dataplus._M_p);
  local_110 = &local_100;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_100 = *plVar6;
    lStack_f8 = puVar5[3];
  }
  else {
    local_100 = *plVar6;
    local_110 = (long *)*puVar5;
  }
  local_108 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  puVar10 = puVar5 + 2;
  if ((ulong *)*puVar5 == puVar10) {
    local_1a8 = *puVar10;
    lStack_1a0 = puVar5[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar10;
    local_1b8 = (ulong *)*puVar5;
  }
  local_1b0 = puVar5[1];
  *puVar5 = puVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  uVar14 = this->m_Size;
  cVar13 = '\x01';
  if (9 < uVar14) {
    uVar12 = uVar14;
    cVar4 = '\x04';
    do {
      cVar13 = cVar4;
      if (uVar12 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_0065d412;
      }
      if (uVar12 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_0065d412;
      }
      if (uVar12 < 10000) goto LAB_0065d412;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_0065d412:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,uVar14);
  uVar14 = CONCAT44(uStack_64,local_68) + local_1b0;
  uVar12 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar12 = local_1a8;
  }
  if (uVar12 < uVar14) {
    uVar12 = 0xf;
    if (local_70 != local_60) {
      uVar12 = local_60[0];
    }
    if (uVar12 < uVar14) goto LAB_0065d48c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_1b8);
  }
  else {
LAB_0065d48c:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_70);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  psVar1 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_1d8.field_2._M_allocated_capacity = *psVar1;
    local_1d8.field_2._8_8_ = puVar5[3];
  }
  else {
    local_1d8.field_2._M_allocated_capacity = *psVar1;
    local_1d8._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1d8._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
  helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_90,&local_b0,&local_d0,&local_1d8,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  start = (size_t)local_138;
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
LAB_0065d64d:
  pRVar2 = (this->m_Remote)._M_t.
           super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
           super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
           super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
  (*pRVar2->_vptr_Remote[7])(pRVar2,start,size,buffer);
  return;
}

Assistant:

void FileRemote::Read(char *buffer, size_t size, size_t start)
{
    WaitForOpen();

    if (start != MaxSizeT)
    {
        if (start >= m_Size)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::file::FileRemote", "Read",
                "couldn't move to start position " + std::to_string(start) +
                    " beyond the size of " + m_Name + " which is " + std::to_string(m_Size));
        }
        m_SeekPos = start;
        errno = 0;
        m_Errno = errno;
    }

    if (m_SeekPos + size > m_Size)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileRemote", "Read",
                                              "can't read " + std::to_string(size) +
                                                  " bytes from position " +
                                                  std::to_string(m_SeekPos) + " from " + m_Name +
                                                  " whose size is " + std::to_string(m_Size));
    }

    m_Remote->Read(start, size, buffer);
    if (m_IsCached)
    {
    }
}